

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPTF.cpp
# Opt level: O2

Result * __thiscall
LongestProcessingTimeFirst::operator()
          (Result *__return_storage_ptr__,LongestProcessingTimeFirst *this,
          shared_ptr<Instance> *instance)

{
  pointer pTVar1;
  pointer pTVar2;
  long lVar3;
  Instance *this_00;
  ulong uVar4;
  __normal_iterator<Task_*,_std::vector<Task,_std::allocator<Task>_>_> __i;
  pointer pTVar5;
  shared_ptr<Instance> SortedInstance;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (Instance *)operator_new(0x20);
  Instance::Instance(this_00,(instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
  std::__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Instance,void>
            ((__shared_ptr<Instance,(__gnu_cxx::_Lock_policy)2> *)&SortedInstance,this_00);
  pTVar1 = ((SortedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tasks)
           .super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data._M_start
  ;
  pTVar2 = ((SortedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tasks)
           .super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pTVar1 != pTVar2) {
    uVar4 = (long)pTVar2 - (long)pTVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::operator()(pTVar1,pTVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar2 - (long)pTVar1 < 0x81) {
      std::operator()(pTVar1,pTVar2);
    }
    else {
      pTVar5 = pTVar1 + 0x10;
      std::operator()(pTVar1,pTVar5);
      for (; pTVar5 != pTVar2; pTVar5 = pTVar5 + 1) {
        std::operator()(pTVar5);
      }
    }
  }
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&SortedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  Greedy::operator()(__return_storage_ptr__,&this->super_Greedy,(shared_ptr<Instance> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&SortedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Result LongestProcessingTimeFirst::operator()(std::shared_ptr<Instance> instance) {
	//we will manipulate our Instance, so it's better to work on a copy

	std::shared_ptr<Instance> SortedInstance( new Instance(*instance) );

	//descendign sort
	std::sort(SortedInstance->tasks.begin(), SortedInstance->tasks.end(),
	[](Task& a, Task& b){return a.getLength() > b.getLength();});
	
	//descending sort ensures that Greedy Algorithm places longest possible Task in every step
	return Greedy::operator()(SortedInstance);
}